

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void idr_resolve(idr *idr,_func_void_uchar_ptr_int *fsetnum)

{
  isoent *piVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  idrent *self;
  
  self = (idr->wait_list).first;
  if (self != (idrent *)0x0) {
    do {
      iVar3 = idr->num_size;
      piVar1 = self->isoent;
      if (self->noff + iVar3 != piVar1->ext_off) {
        memmove(piVar1->identifier + (long)self->noff + (long)iVar3,
                piVar1->identifier + piVar1->ext_off,(long)piVar1->ext_len + (long)idr->null_size);
        iVar3 = self->noff + iVar3;
        piVar1 = self->isoent;
        piVar1->ext_off = iVar3;
        piVar1->id_len = iVar3 + piVar1->ext_len;
      }
      iVar3 = self->noff;
      pcVar2 = self->isoent->identifier;
      do {
        iVar4 = self->avail->rename_num;
        self->avail->rename_num = iVar4 + 1;
        (*fsetnum)((uchar *)(pcVar2 + iVar3),iVar4);
        iVar4 = __archive_rb_tree_insert_node(&idr->rbtree,&self->rbnode);
      } while (iVar4 == 0);
      self = self->wnext;
    } while (self != (idrent *)0x0);
  }
  return;
}

Assistant:

static void
idr_resolve(struct idr *idr, void (*fsetnum)(unsigned char *p, int num))
{
	struct idrent *n;
	unsigned char *p;

	for (n = idr->wait_list.first; n != NULL; n = n->wnext) {
		idr_extend_identifier(n, idr->num_size, idr->null_size);
		p = (unsigned char *)n->isoent->identifier + n->noff;
		do {
			fsetnum(p, n->avail->rename_num++);
		} while (!__archive_rb_tree_insert_node(
		    &(idr->rbtree), &(n->rbnode)));
	}
}